

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

void __thiscall flow::BasicBlock::unlinkSuccessor(BasicBlock *this,BasicBlock *successor)

{
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  _Var1;
  BasicBlock *local_20;
  BasicBlock *local_18;
  
  local_20 = successor;
  if (successor == (BasicBlock *)0x0) {
    __assert_fail("successor != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xd9,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  local_18 = this;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::BasicBlock*const>>
                    ((successor->predecessors_).
                     super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (successor->predecessors_).
                     super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (successor->predecessors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::erase
              (&successor->predecessors_,(const_iterator)_Var1._M_current);
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::BasicBlock*const>>
                      ((this->successors_).
                       super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->successors_).
                       super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_20);
    if (_Var1._M_current !=
        (this->successors_).
        super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::erase
                (&this->successors_,(const_iterator)_Var1._M_current);
      return;
    }
    __assert_fail("s != successors_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xe1,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  __assert_fail("p != successor->predecessors_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,0xdd,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
}

Assistant:

void BasicBlock::unlinkSuccessor(BasicBlock* successor) {
  assert(successor != nullptr);

  auto p = std::find(successor->predecessors_.begin(),
                     successor->predecessors_.end(), this);
  assert(p != successor->predecessors_.end());
  successor->predecessors_.erase(p);

  auto s = std::find(successors_.begin(), successors_.end(), successor);
  assert(s != successors_.end());
  successors_.erase(s);
}